

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O2

int bytes_compar(uint8_t *a,size_t alen,uint8_t *b,size_t blen)

{
  int iVar1;
  uint uVar2;
  
  if (alen == blen) {
    iVar1 = memcmp(a,b,alen);
    return iVar1;
  }
  if (alen < blen) {
    uVar2 = memcmp(a,b,alen);
    uVar2 = uVar2 | -(uint)(uVar2 == 0);
  }
  else {
    iVar1 = memcmp(a,b,blen);
    uVar2 = iVar1 + (uint)(iVar1 == 0);
  }
  return uVar2;
}

Assistant:

static int bytes_compar(const uint8_t *a, size_t alen, const uint8_t *b,
                        size_t blen) {
  int rv;

  if (alen == blen) {
    return memcmp(a, b, alen);
  }

  if (alen < blen) {
    rv = memcmp(a, b, alen);

    if (rv == 0) {
      return -1;
    }

    return rv;
  }

  rv = memcmp(a, b, blen);

  if (rv == 0) {
    return 1;
  }

  return rv;
}